

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_zlib_decompressv
               (ucvector *out,uchar *in,size_t insize,LodePNGDecompressSettings *settings)

{
  uint uVar1;
  uint uVar2;
  ucvector *in_RCX;
  ulong in_RDX;
  byte *in_RSI;
  uint checksum;
  uint ADLER32;
  uint FDICT;
  uint CINFO;
  uint CM;
  uint error;
  uint in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  uint local_4;
  
  if (in_RDX < 2) {
    local_4 = 0x35;
  }
  else if (((uint)*in_RSI * 0x100 + (uint)in_RSI[1]) % 0x1f == 0) {
    if (((*in_RSI & 0xf) == 8) && ((uint)((int)(uint)*in_RSI >> 4) < 8)) {
      if (((int)(uint)in_RSI[1] >> 5 & 1U) == 0) {
        local_4 = inflatev(in_RCX,(uchar *)0x8,
                           CONCAT44((int)(uint)*in_RSI >> 4,(int)(uint)in_RSI[1] >> 5) &
                           0xffffffff00000001,
                           (LodePNGDecompressSettings *)
                           CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
        if (local_4 == 0) {
          if (*(int *)&in_RCX->data == 0) {
            uVar1 = lodepng_read32bitInt(in_RSI + (in_RDX - 4));
            uVar2 = adler32((uchar *)CONCAT44(uVar1,in_stack_ffffffffffffffc0),
                            in_stack_ffffffffffffffbc);
            if (uVar2 != uVar1) {
              return 0x3a;
            }
          }
          local_4 = 0;
        }
      }
      else {
        local_4 = 0x1a;
      }
    }
    else {
      local_4 = 0x19;
    }
  }
  else {
    local_4 = 0x18;
  }
  return local_4;
}

Assistant:

static unsigned lodepng_zlib_decompressv(ucvector* out,
  const unsigned char* in, size_t insize,
  const LodePNGDecompressSettings* settings) {
  unsigned error = 0;
  unsigned CM, CINFO, FDICT;

  if (insize < 2) return 53; /*error, size of zlib data too small*/
  /*read information from zlib header*/
  if ((in[0] * 256 + in[1]) % 31 != 0) {
    /*error: 256 * in[0] + in[1] must be a multiple of 31, the FCHECK value is supposed to be made that way*/
    return 24;
  }

  CM = in[0] & 15;
  CINFO = (in[0] >> 4) & 15;
  /*FCHECK = in[1] & 31;*/ /*FCHECK is already tested above*/
  FDICT = (in[1] >> 5) & 1;
  /*FLEVEL = (in[1] >> 6) & 3;*/ /*FLEVEL is not used here*/

  if (CM != 8 || CINFO > 7) {
    /*error: only compression method 8: inflate with sliding window of 32k is supported by the PNG spec*/
    return 25;
  }
  if (FDICT != 0) {
    /*error: the specification of PNG says about the zlib stream:
      "The additional flags shall not specify a preset dictionary."*/
    return 26;
  }

  error = inflatev(out, in + 2, insize - 2, settings);
  if (error) return error;

  if (!settings->ignore_adler32) {
    unsigned ADLER32 = lodepng_read32bitInt(&in[insize - 4]);
    unsigned checksum = adler32(out->data, (unsigned)(out->size));
    if (checksum != ADLER32) return 58; /*error, adler checksum not correct, data must be corrupted*/
  }

  return 0; /*no error*/
}